

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_dec.c
# Opt level: O0

VP8StatusCode WebPCopyDecBufferPixels(WebPDecBuffer *src_buf,WebPDecBuffer *dst_buf)

{
  VP8StatusCode VVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long in_RSI;
  WEBP_CSP_MODE *in_RDI;
  WebPYUVABuffer *dst_1;
  WebPYUVABuffer *src_1;
  WebPRGBABuffer *dst;
  WebPRGBABuffer *src;
  undefined8 in_stack_ffffffffffffffb8;
  int dst_stride;
  undefined8 uVar5;
  uint8_t *in_stack_ffffffffffffffc0;
  uint8_t *dst_00;
  undefined8 in_stack_ffffffffffffffc8;
  uint8_t *in_stack_ffffffffffffffd0;
  WEBP_CSP_MODE *src_00;
  VP8StatusCode local_4;
  
  iVar3 = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  *(WEBP_CSP_MODE *)(in_RSI + 4) = in_RDI[1];
  *(WEBP_CSP_MODE *)(in_RSI + 8) = in_RDI[2];
  VVar1 = CheckDecBuffer((WebPDecBuffer *)dst);
  if (VVar1 == VP8_STATUS_OK) {
    iVar2 = WebPIsRGBMode(*in_RDI);
    dst_stride = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
    if (iVar2 == 0) {
      src_00 = in_RDI + 4;
      lVar4 = in_RSI + 0x10;
      WebPCopyPlane((uint8_t *)src_00,(int)((ulong)lVar4 >> 0x20),in_stack_ffffffffffffffc0,
                    dst_stride,(int)in_stack_ffffffffffffffb8,0);
      uVar5 = *(undefined8 *)(lVar4 + 8);
      WebPCopyPlane((uint8_t *)src_00,(int)((ulong)lVar4 >> 0x20),in_stack_ffffffffffffffc0,
                    (int)((ulong)uVar5 >> 0x20),(int)uVar5,0);
      dst_00 = *(uint8_t **)(lVar4 + 0x10);
      WebPCopyPlane((uint8_t *)src_00,(int)((ulong)lVar4 >> 0x20),dst_00,(int)((ulong)uVar5 >> 0x20)
                    ,(int)uVar5,0);
      iVar2 = (int)((ulong)lVar4 >> 0x20);
      iVar3 = WebPIsAlphaMode(MODE_RGB);
      if (iVar3 != 0) {
        WebPCopyPlane((uint8_t *)src_00,iVar2,dst_00,(int)((ulong)uVar5 >> 0x20),(int)uVar5,0);
      }
    }
    else {
      WebPCopyPlane(in_stack_ffffffffffffffd0,iVar3,in_stack_ffffffffffffffc0,dst_stride,
                    (int)in_stack_ffffffffffffffb8,0);
    }
    local_4 = VP8_STATUS_OK;
  }
  else {
    local_4 = VP8_STATUS_INVALID_PARAM;
  }
  return local_4;
}

Assistant:

VP8StatusCode WebPCopyDecBufferPixels(const WebPDecBuffer* const src_buf,
                                      WebPDecBuffer* const dst_buf) {
  assert(src_buf != NULL && dst_buf != NULL);
  assert(src_buf->colorspace == dst_buf->colorspace);

  dst_buf->width = src_buf->width;
  dst_buf->height = src_buf->height;
  if (CheckDecBuffer(dst_buf) != VP8_STATUS_OK) {
    return VP8_STATUS_INVALID_PARAM;
  }
  if (WebPIsRGBMode(src_buf->colorspace)) {
    const WebPRGBABuffer* const src = &src_buf->u.RGBA;
    const WebPRGBABuffer* const dst = &dst_buf->u.RGBA;
    WebPCopyPlane(src->rgba, src->stride, dst->rgba, dst->stride,
                  src_buf->width * kModeBpp[src_buf->colorspace],
                  src_buf->height);
  } else {
    const WebPYUVABuffer* const src = &src_buf->u.YUVA;
    const WebPYUVABuffer* const dst = &dst_buf->u.YUVA;
    WebPCopyPlane(src->y, src->y_stride, dst->y, dst->y_stride,
                  src_buf->width, src_buf->height);
    WebPCopyPlane(src->u, src->u_stride, dst->u, dst->u_stride,
                  (src_buf->width + 1) / 2, (src_buf->height + 1) / 2);
    WebPCopyPlane(src->v, src->v_stride, dst->v, dst->v_stride,
                  (src_buf->width + 1) / 2, (src_buf->height + 1) / 2);
    if (WebPIsAlphaMode(src_buf->colorspace)) {
      WebPCopyPlane(src->a, src->a_stride, dst->a, dst->a_stride,
                    src_buf->width, src_buf->height);
    }
  }
  return VP8_STATUS_OK;
}